

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

StatusOr<google::protobuf::FeatureResolver> *
google::protobuf::FeatureResolver::Create
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *compiled_defaults)

{
  _anonymous_namespace_ *this;
  bool bVar1;
  Edition EVar2;
  Edition EVar3;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  Status *x;
  FeatureSet *pFVar4;
  FeatureSet local_1d8;
  FeatureResolver local_188;
  Status local_138;
  Status _status_1;
  StatusOr<google::protobuf::FeatureSet> features;
  Status local_d0;
  Status _status;
  FeatureSet features_1;
  Status local_70;
  FeatureSetDefaults_FeatureSetEditionDefault *local_68;
  FeatureSetDefaults_FeatureSetEditionDefault *edition_default;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *__range2;
  Edition prev_edition;
  Status local_28;
  FeatureSetDefaults *local_20;
  FeatureSetDefaults *compiled_defaults_local;
  StatusOr<google::protobuf::FeatureResolver> *pSStack_10;
  Edition edition_local;
  
  local_20 = compiled_defaults;
  compiled_defaults_local._4_4_ = edition;
  pSStack_10 = __return_storage_ptr__;
  EVar2 = FeatureSetDefaults::minimum_edition(compiled_defaults);
  EVar3 = compiled_defaults_local._4_4_;
  if ((int)edition < (int)EVar2) {
    EVar2 = FeatureSetDefaults::minimum_edition(local_20);
    protobuf::(anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&local_28,"Edition ",EVar3,
               " is earlier than the minimum supported edition ",EVar2);
    absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
    StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_28);
    absl::lts_20250127::Status::~Status(&local_28);
  }
  else {
    EVar2 = FeatureSetDefaults::maximum_edition(local_20);
    EVar3 = compiled_defaults_local._4_4_;
    if ((int)EVar2 < (int)compiled_defaults_local._4_4_) {
      EVar2 = FeatureSetDefaults::maximum_edition(local_20);
      protobuf::(anonymous_namespace)::
      Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
                ((_anonymous_namespace_ *)&stack0xffffffffffffffc0,"Edition ",EVar3,
                 " is later than the maximum supported edition ",EVar2);
      absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
      StatusOr<absl::lts_20250127::Status,_0>
                (__return_storage_ptr__,(Status *)&stack0xffffffffffffffc0);
      absl::lts_20250127::Status::~Status((Status *)&stack0xffffffffffffffc0);
    }
    else {
      __range2._4_4_ = EDITION_UNKNOWN;
      this_00 = FeatureSetDefaults::defaults(local_20);
      __end2 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::
               begin(this_00);
      edition_default =
           (FeatureSetDefaults_FeatureSetEditionDefault *)
           RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end
                     (this_00);
      while (bVar1 = internal::operator!=(&__end2,(iterator *)&edition_default), bVar1) {
        local_68 = internal::
                   RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                   ::operator*(&__end2);
        EVar3 = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_68);
        if (EVar3 == EDITION_UNKNOWN) {
          EVar3 = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_68);
          protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
                    ((_anonymous_namespace_ *)&local_70,"Invalid edition ",EVar3," specified.");
          absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
          StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_70);
          absl::lts_20250127::Status::~Status(&local_70);
          return __return_storage_ptr__;
        }
        if ((__range2._4_4_ != EDITION_UNKNOWN) &&
           (EVar3 = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_68),
           (int)EVar3 <= (int)__range2._4_4_)) {
          EVar3 = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_68);
          this = (_anonymous_namespace_ *)((long)&features_1.field_0 + 0x38);
          protobuf::(anonymous_namespace)::
          Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition,char_const*>
                    (this,"Feature set defaults are not strictly increasing.  Edition ",
                     __range2._4_4_," is greater than or equal to edition ",EVar3,".");
          absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
          StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,(Status *)this);
          absl::lts_20250127::Status::~Status((Status *)((long)&features_1.field_0 + 0x38));
          return __return_storage_ptr__;
        }
        pFVar4 = FeatureSetDefaults_FeatureSetEditionDefault::fixed_features(local_68);
        FeatureSet::FeatureSet((FeatureSet *)&_status,pFVar4);
        pFVar4 = FeatureSetDefaults_FeatureSetEditionDefault::overridable_features(local_68);
        FeatureSet::MergeFrom((FeatureSet *)&_status,pFVar4);
        anon_unknown_21::ValidateMergedFeatures((anon_unknown_21 *)&local_d0,(FeatureSet *)&_status)
        ;
        bVar1 = absl::lts_20250127::Status::ok(&local_d0);
        bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
        if (bVar1) {
          absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
          StatusOr<const_absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_d0);
        }
        absl::lts_20250127::Status::~Status(&local_d0);
        if (!bVar1) {
          __range2._4_4_ = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_68);
        }
        FeatureSet::~FeatureSet((FeatureSet *)&_status);
        if (bVar1 && bVar1) {
          return __return_storage_ptr__;
        }
        internal::
        RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::
        operator++(&__end2);
      }
      internal::GetEditionFeatureSetDefaults
                ((StatusOr<google::protobuf::FeatureSet> *)&_status_1,compiled_defaults_local._4_4_,
                 local_20);
      x = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::status
                    ((StatusOr<google::protobuf::FeatureSet> *)&_status_1);
      absl::lts_20250127::Status::Status(&local_138,x);
      bVar1 = absl::lts_20250127::Status::ok(&local_138);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
        StatusOr<const_absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_138);
      }
      absl::lts_20250127::Status::~Status(&local_138);
      if (!bVar1) {
        pFVar4 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::value
                           ((StatusOr<google::protobuf::FeatureSet> *)&_status_1);
        FeatureSet::FeatureSet(&local_1d8,pFVar4);
        FeatureResolver(&local_188,&local_1d8);
        absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::
        StatusOr<google::protobuf::FeatureResolver,_0>(__return_storage_ptr__,&local_188);
        ~FeatureResolver(&local_188);
        FeatureSet::~FeatureSet(&local_1d8);
      }
      absl::lts_20250127::StatusOr<google::protobuf::FeatureSet>::~StatusOr
                ((StatusOr<google::protobuf::FeatureSet> *)&_status_1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureResolver> FeatureResolver::Create(
    Edition edition, const FeatureSetDefaults& compiled_defaults) {
  if (edition < compiled_defaults.minimum_edition()) {
    return Error("Edition ", edition,
                 " is earlier than the minimum supported edition ",
                 compiled_defaults.minimum_edition());
  }
  if (compiled_defaults.maximum_edition() < edition) {
    return Error("Edition ", edition,
                 " is later than the maximum supported edition ",
                 compiled_defaults.maximum_edition());
  }

  // Validate compiled defaults.
  Edition prev_edition = EDITION_UNKNOWN;
  for (const auto& edition_default : compiled_defaults.defaults()) {
    if (edition_default.edition() == EDITION_UNKNOWN) {
      return Error("Invalid edition ", edition_default.edition(),
                   " specified.");
    }
    if (prev_edition != EDITION_UNKNOWN) {
      if (edition_default.edition() <= prev_edition) {
        return Error(
            "Feature set defaults are not strictly increasing.  Edition ",
            prev_edition, " is greater than or equal to edition ",
            edition_default.edition(), ".");
      }
    }
    FeatureSet features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    RETURN_IF_ERROR(ValidateMergedFeatures(features));

    prev_edition = edition_default.edition();
  }

  auto features =
      internal::GetEditionFeatureSetDefaults(edition, compiled_defaults);
  RETURN_IF_ERROR(features.status());
  return FeatureResolver(std::move(features.value()));
}